

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O2

Type __thiscall
wasm::GlobalTypeRewriter::mapTypes(std::unordered_map<wasm::HeapType,wasm::HeapType,std::hash<wasm::
HeapType>,std::equal_to<wasm::HeapType>,std::allocator<std::pair<wasm::HeapType_const,wasm::
HeapType>>>const&)::CodeUpdater::getNew(wasm::Type_(void *this,Type type)

{
  HeapType HVar1;
  Tuple *__x;
  Type TVar2;
  Type *t;
  undefined1 auVar3 [8];
  undefined1 local_48 [8];
  Tuple tuple;
  Type local_28;
  Type type_local;
  
  local_28.id = type.id;
  if ((type.id & 1) == 0 && 6 < type.id) {
    HVar1 = wasm::Type::getHeapType(&local_28);
    HVar1 = HeapType_(this,HVar1);
    type = wasm::Type::with(&local_28,HVar1);
  }
  else if ((type.id & 1) != 0 && 6 < type.id) {
    __x = wasm::Type::getTuple(&local_28);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_48,__x);
    for (auVar3 = local_48;
        auVar3 != (undefined1  [8])
                  tuple.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                  super__Vector_impl_data._M_start; auVar3 = (undefined1  [8])((long)auVar3 + 8)) {
      TVar2 = Type_(this,((pointer)auVar3)->id);
      ((pointer)auVar3)->id = TVar2.id;
    }
    wasm::Type::Type((Type *)&tuple.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,(Tuple *)local_48);
    std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
              ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)local_48);
    type.id = (uintptr_t)
              tuple.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  }
  return (Type)type.id;
}

Assistant:

Type getNew(Type type) {
      if (type.isRef()) {
        return type.with(getNew(type.getHeapType()));
      }
      if (type.isTuple()) {
        auto tuple = type.getTuple();
        for (auto& t : tuple) {
          t = getNew(t);
        }
        return Type(tuple);
      }
      return type;
    }